

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O1

void new_points_calc_all(Am_Object *inter,Am_Object *ref_obj,bool first_point,int x,int y,
                        bool *abort,Am_Inter_Location *data)

{
  bool as_line;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  undefined7 in_register_00000011;
  int d;
  int c;
  int b;
  int a;
  int y_local;
  int x_local;
  Am_Object init_ref_obj;
  Am_Object local_38;
  
  y_local = y;
  x_local = x;
  pAVar2 = Am_Object::Get(inter,0xdb,0);
  as_line = Am_Value::operator_cast_to_bool(pAVar2);
  if ((int)CONCAT71(in_register_00000011,first_point) == 0) {
    pAVar2 = Am_Object::Get(inter,0x12e,0);
    Am_Object::Am_Object(&init_ref_obj,pAVar2);
    bVar1 = Am_Object::operator!=(&init_ref_obj,ref_obj);
    if (bVar1) {
      Am_Translate_Coordinates(ref_obj,x_local,y_local,&init_ref_obj,&x_local,&y_local);
      Am_Object::operator=(ref_obj,&init_ref_obj);
    }
    Am_Object::~Am_Object(&init_ref_obj);
  }
  else {
    value = Am_Object::operator_cast_to_Am_Wrapper_(ref_obj);
    Am_Object::Set(inter,0x12e,value,0);
  }
  if (as_line) {
    calc_line_two_points(inter,first_point,x_local,y_local,abort,&a,&b,&c,&d);
  }
  else {
    calc_rect_two_points(inter,first_point,x_local,y_local,abort,&a,&b,&c,&d);
  }
  Am_Object::Am_Object(&local_38,ref_obj);
  Am_Inter_Location::Set_Location(data,as_line,&local_38,a,b,c,d,false);
  Am_Object::~Am_Object(&local_38);
  if (first_point) {
    Am_Inter_Location::Set_Growing(data,false,true);
  }
  return;
}

Assistant:

void
new_points_calc_all(Am_Object &inter, Am_Object &ref_obj, bool first_point,
                    int x, int y, bool &abort, Am_Inter_Location &data)
{
  bool as_line = inter.Get(Am_AS_LINE);
  int a, b, c, d;
  if (first_point)
    inter.Set(Am_INITIAL_REF_OBJECT, ref_obj);
  else {
    Am_Object init_ref_obj = inter.Get(Am_INITIAL_REF_OBJECT);
    if (init_ref_obj != ref_obj) {
      Am_Translate_Coordinates(ref_obj, x, y, init_ref_obj, x, y);
      ref_obj = init_ref_obj;
    }
  }

  if (as_line)
    calc_line_two_points(inter, first_point, x, y, abort, a, b, c, d);
  else
    calc_rect_two_points(inter, first_point, x, y, abort, a, b, c, d);
  data.Set_Location(as_line, ref_obj, a, b, c, d, false);
  if (first_point)
    data.Set_Growing(false);
}